

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O0

Macros * __thiscall pstack::Dwarf::Unit::getMacros(Unit *this)

{
  Info *__args_1;
  bool bVar1;
  const_iterator pAVar2;
  pointer pMVar3;
  intmax_t local_d8;
  undefined1 local_d0 [32];
  Attribute a;
  AttrName i;
  const_iterator __end3;
  const_iterator __begin3;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 local_60 [24];
  initializer_list<pstack::Dwarf::AttrName> *__range3;
  DIE *local_20;
  DIE *root_;
  Unit *this_local;
  
  root_ = (DIE *)this;
  bVar1 = std::operator==(&this->macros,(nullptr_t)0x0);
  if (bVar1) {
    root((DIE *)&__range3,this);
    local_20 = (DIE *)&__range3;
    __begin3._4_4_ = 0x2119;
    local_68 = 0x79;
    local_64 = 0x43;
    local_60._0_8_ = (long)&__begin3 + 4;
    local_60._8_8_ = (Section *)0x3;
    local_60._16_8_ = local_60;
    __end3 = std::initializer_list<pstack::Dwarf::AttrName>::begin
                       ((initializer_list<pstack::Dwarf::AttrName> *)local_60._16_8_);
    pAVar2 = std::initializer_list<pstack::Dwarf::AttrName>::end
                       ((initializer_list<pstack::Dwarf::AttrName> *)local_60._16_8_);
    for (; __end3 != pAVar2; __end3 = __end3 + 1) {
      a.formp._4_4_ = *__end3;
      DIE::attribute((Attribute *)(local_d0 + 0x18),local_20,a.formp._4_4_,false);
      bVar1 = DIE::Attribute::valid((Attribute *)(local_d0 + 0x18));
      if (bVar1) {
        __args_1 = this->dwarf;
        local_d8 = DIE::Attribute::operator_cast_to_long((Attribute *)(local_d0 + 0x18));
        std::make_unique<pstack::Dwarf::Macros,pstack::Dwarf::Info_const&,long,int>
                  ((Info *)local_d0,(long *)__args_1,(int *)&local_d8);
        std::unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>::
        operator=(&this->macros,
                  (unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_> *)
                  local_d0);
        std::unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>::
        ~unique_ptr((unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
                     *)local_d0);
        this_local = (Unit *)std::
                             unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
                             ::get(&this->macros);
      }
      DIE::Attribute::~Attribute((Attribute *)(local_d0 + 0x18));
      if (bVar1) goto LAB_00243d8f;
    }
    bVar1 = false;
LAB_00243d8f:
    DIE::~DIE((DIE *)&__range3);
    if (bVar1 != false) {
      return (Macros *)this_local;
    }
  }
  pMVar3 = std::unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>::get
                     (&this->macros);
  return pMVar3;
}

Assistant:

const Macros *
Unit::getMacros()
{
    if (macros == nullptr) {
       const DIE &root_ = root();
       for (auto i : { DW_AT_GNU_macros, DW_AT_macros, DW_AT_macro_info }) {
          auto a = root_.attribute(i);
          if (a.valid()) {
              macros = std::make_unique<Macros>(*dwarf, intmax_t(a), i == DW_AT_macro_info ? 4 : 5);
              return macros.get();
          }
       }
    }
    return macros.get();
}